

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SharedPtrTests_self_Self3_Test::TestBody(SharedPtrTests_self_Self3_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  size_t local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58;
  int *local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  SharedPtr<int> t1;
  int *a;
  SharedPtrTests_self_Self3_Test *this_local;
  
  t1.pointersAmount = (atomic<unsigned_long> *)operator_new(4);
  *(int *)&((t1.pointersAmount)->super___atomic_base<unsigned_long>)._M_i = 4;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)local_28,(int *)t1.pointersAmount);
  std::swap<SharedPtr<int>>((SharedPtr<int> *)local_28,(SharedPtr<int> *)local_28);
  local_50 = SharedPtr<int>::get((SharedPtr<int> *)local_28);
  testing::internal::EqHelper<false>::Compare<int*,int*>
            ((EqHelper<false> *)local_48,"t1.get()","a",&local_50,(int **)&t1.pointersAmount);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  local_78 = SharedPtr<int>::use_count((SharedPtr<int> *)local_28);
  local_7c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_70,"t1.use_count()","1",&local_78,&local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)local_28);
  return;
}

Assistant:

TEST(SharedPtrTests_self, Self3) {
	int* a;
	a = new int;
	*a = 4;
	SharedPtr<int> t1(a);
	std::swap(t1, t1);
	EXPECT_EQ(t1.get(),a);
	EXPECT_EQ(t1.use_count(), 1);
}